

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,_Bool noexpire,char *lineptr
                        ,char *domain,char *path,_Bool secure)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  Cookie **ppCVar4;
  uint uVar5;
  _Bool _Var6;
  _Bool _Var7;
  int iVar8;
  CURLofft CVar9;
  Cookie *pCVar10;
  size_t sVar11;
  char *pcVar12;
  size_t sVar13;
  curl_off_t cVar14;
  time_t tVar15;
  size_t sVar16;
  char *pcVar17;
  size_t max;
  char *pcVar18;
  byte bVar19;
  long lVar20;
  uint uVar21;
  curl_off_t *num;
  Cookie *pCVar22;
  Cookie *pCVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  byte bVar27;
  Cookie *local_2070;
  char *local_2050;
  undefined8 local_2040;
  char what [4096];
  char name [4096];
  
  bVar27 = 0;
  local_2040 = time((time_t *)0x0);
  pCVar10 = (Cookie *)(*Curl_ccalloc)(1,0x68);
  if (pCVar10 == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    sVar11 = strlen(lineptr);
    if (5000 < sVar11) {
LAB_00568d86:
      (*Curl_cfree)(pCVar10);
      return (Cookie *)0x0;
    }
    pcVar12 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    local_2050 = domain;
    bVar26 = false;
    do {
      what[0] = '\0';
      name._0_8_ = name._0_8_ & 0xffffffffffffff00;
      iVar8 = __isoc99_sscanf(lineptr,"%4095[^;\r\n=] =%4095[^;\r\n]",name,what);
      bVar25 = bVar26;
      if (0 < iVar8) {
        sVar11 = strlen(what);
        sVar13 = strlen(name);
        if (sVar13 + sVar11 < 0x1001 && (sVar11 < 0xfff && sVar13 < 0xfff)) {
          cVar2 = lineptr[sVar13];
          if (sVar13 == 0) {
            sVar13 = 0;
          }
          else if ((lineptr[sVar13 - 1] == ' ') || (lineptr[sVar13 - 1] == '\t')) {
            for (; ((cVar1 = lineptr[sVar13 - 1], cVar1 == ' ' ||
                    ((cVar1 != '\0' && (cVar1 == '\t')))) && (sVar13 != 0)); sVar13 = sVar13 - 1) {
            }
            name[sVar13] = '\0';
          }
          for (; (sVar11 != 0 && ((what[sVar11 - 1] == ' ' || (what[sVar11 - 1] == '\t'))));
              sVar11 = sVar11 - 1) {
            what[sVar11 - 1] = '\0';
          }
          for (pcVar18 = what; (*pcVar18 == ' ' || (*pcVar18 == '\t')); pcVar18 = pcVar18 + 1) {
          }
          if (((3 < sVar13) && (name[0] == '_')) && (name[1] == '_')) {
            iVar8 = Curl_strncasecompare("__Secure-",name,9);
            bVar19 = 1;
            if (iVar8 == 0) {
              iVar8 = Curl_strncasecompare("__Host-",name,7);
              bVar19 = 2;
              if (iVar8 == 0) goto LAB_00568f22;
            }
            pCVar10->prefix = pCVar10->prefix | bVar19;
          }
LAB_00568f22:
          if (pCVar10->name == (char *)0x0) {
            bVar25 = true;
            iVar8 = 4;
            if (cVar2 == '=') {
              pcVar17 = (*Curl_cstrdup)(name);
              pCVar10->name = pcVar17;
              pcVar18 = (*Curl_cstrdup)(pcVar18);
              pCVar10->value = pcVar18;
              if (pcVar18 != (char *)0x0 && pCVar10->name != (char *)0x0) goto LAB_00569255;
            }
          }
          else if (sVar11 != 0) {
LAB_00569015:
            iVar8 = Curl_strcasecompare("path",name);
            if (iVar8 == 0) {
              iVar8 = Curl_strcasecompare("domain",name);
              if (iVar8 == 0) {
                iVar8 = Curl_strcasecompare("version",name);
                if (iVar8 == 0) {
                  iVar8 = Curl_strcasecompare("max-age",name);
                  if (iVar8 == 0) {
                    iVar8 = Curl_strcasecompare("expires",name);
                    if (iVar8 == 0) goto LAB_00569255;
                    (*Curl_cfree)(pCVar10->expirestr);
                    pcVar18 = (*Curl_cstrdup)(pcVar18);
                    pCVar10->expirestr = pcVar18;
                  }
                  else {
                    (*Curl_cfree)(pCVar10->maxage);
                    pcVar18 = (*Curl_cstrdup)(pcVar18);
                    pCVar10->maxage = pcVar18;
                  }
                }
                else {
                  (*Curl_cfree)(pCVar10->version);
                  pcVar18 = (*Curl_cstrdup)(pcVar18);
                  pCVar10->version = pcVar18;
                }
                if (pcVar18 != (char *)0x0) goto LAB_00569255;
                bVar25 = true;
                iVar8 = 4;
              }
              else {
                pcVar18 = pcVar18 + (*pcVar18 == '.');
                pcVar17 = strchr(pcVar18,0x2e);
                if ((pcVar17 == (char *)0x0) &&
                   (iVar8 = Curl_strcasecompare(pcVar18,"localhost"), iVar8 == 0)) {
                  local_2050 = ":";
                }
                pcVar17 = local_2050;
                if (local_2050 == (char *)0x0) {
                  pcVar17 = pcVar18;
                }
                _Var6 = isip(pcVar17);
                if (local_2050 == (char *)0x0) {
LAB_00569126:
                  (*Curl_cfree)(pCVar10->domain);
                  pcVar18 = (*Curl_cstrdup)(pcVar18);
                  pCVar10->domain = pcVar18;
                  bVar24 = pcVar18 == (char *)0x0;
                  bVar3 = !bVar24;
                  if (bVar24) {
                    bVar25 = true;
                  }
                  if (_Var6 || bVar24) {
                    iVar8 = (uint)bVar24 << 2;
                    bVar26 = bVar25;
                  }
                  else {
                    pCVar10->tailmatch = true;
                    iVar8 = 0;
                    bVar3 = true;
                  }
                }
                else {
                  if (_Var6) {
                    iVar8 = strcmp(pcVar18,local_2050);
                    if (iVar8 == 0) goto LAB_00569126;
                    if (!_Var6) goto LAB_00569113;
                  }
                  else {
LAB_00569113:
                    _Var7 = tailmatch(pcVar18,local_2050);
                    if (_Var7) goto LAB_00569126;
                  }
                  iVar8 = 0;
                  Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar18);
                  bVar3 = true;
                  bVar26 = true;
                }
                bVar25 = bVar26;
                if (bVar3) goto LAB_00569255;
              }
            }
            else {
              (*Curl_cfree)(pCVar10->path);
              pcVar18 = (*Curl_cstrdup)(pcVar18);
              pCVar10->path = pcVar18;
              bVar25 = true;
              iVar8 = 4;
              if (pcVar18 != (char *)0x0) {
                (*Curl_cfree)(pCVar10->spath);
                pcVar18 = sanitize_cookie_path(pCVar10->path);
                pCVar10->spath = pcVar18;
                if (pcVar18 != (char *)0x0) goto LAB_00569255;
              }
            }
          }
          else {
            iVar8 = Curl_strcasecompare("secure",name);
            if (iVar8 == 0) {
              iVar8 = Curl_strcasecompare("httponly",name);
              if (iVar8 == 0) {
                if (cVar2 == '=') goto LAB_00569015;
              }
              else {
                pCVar10->httponly = true;
              }
            }
            else {
              if ((!secure) && (c->running != false)) {
                iVar8 = 4;
                bVar25 = true;
                goto LAB_0056925e;
              }
              pCVar10->secure = true;
            }
LAB_00569255:
            iVar8 = 0;
            bVar25 = bVar26;
          }
        }
        else {
          freecookie(pCVar10);
          Curl_infof(data,"oversized cookie dropped, name/val %zu + %zu bytes\n",sVar13,sVar11);
          iVar8 = 1;
        }
LAB_0056925e:
        if (iVar8 != 0) {
          if (iVar8 != 4) {
            return (Cookie *)0x0;
          }
          break;
        }
      }
      if ((pcVar12 == (char *)0x0) || (*pcVar12 == '\0')) {
        pcVar12 = (char *)0x0;
      }
      else {
        do {
          do {
            lineptr = pcVar12 + 1;
            cVar2 = *lineptr;
            pcVar12 = lineptr;
          } while (cVar2 == ' ');
        } while (cVar2 == '\t');
        pcVar12 = strchr(lineptr,0x3b);
        if (pcVar12 == (char *)0x0) {
          if (cVar2 == '\0') {
            pcVar12 = (char *)0x0;
          }
          else {
            sVar11 = strlen(lineptr);
            pcVar12 = lineptr + sVar11;
          }
        }
      }
      bVar26 = bVar25;
    } while (pcVar12 != (char *)0x0);
    pcVar12 = pCVar10->maxage;
    if (pcVar12 == (char *)0x0) {
      if (pCVar10->expirestr != (char *)0x0) {
        tVar15 = curl_getdate(pCVar10->expirestr,(time_t *)0x0);
        pCVar10->expires = tVar15;
        if (tVar15 == 0) {
          pCVar10->expires = 1;
        }
        else if (tVar15 < 0) {
          pCVar10->expires = 0;
        }
      }
    }
    else {
      num = &pCVar10->expires;
      CVar9 = curlx_strtoofft(pcVar12 + (*pcVar12 == '\"'),(char **)0x0,10,num);
      if (CVar9 == CURL_OFFT_OK) {
        lVar20 = *num;
        if (lVar20 == 0) {
          *num = 1;
        }
        else {
          if (lVar20 <= 0x7fffffffffffffff - local_2040) {
            cVar14 = lVar20 + local_2040;
            goto LAB_00569715;
          }
          *num = 0x7fffffffffffffff;
        }
      }
      else if (CVar9 == CURL_OFFT_FLOW) {
        cVar14 = 0x7fffffffffffffff;
LAB_00569715:
        *num = cVar14;
      }
    }
    bVar26 = bVar25;
    if (((!bVar25) && (pCVar10->domain == (char *)0x0)) && (local_2050 != (char *)0x0)) {
      pcVar12 = (*Curl_cstrdup)(local_2050);
      pCVar10->domain = pcVar12;
      bVar26 = true;
      if (pcVar12 != (char *)0x0) {
        bVar26 = bVar25;
      }
    }
    if (((!bVar26) && (path != (char *)0x0)) && (pCVar10->path == (char *)0x0)) {
      pcVar12 = strchr(path,0x3f);
      if (pcVar12 == (char *)0x0) {
        pcVar12 = strrchr(path,0x2f);
      }
      else {
        pcVar12 = (char *)Curl_memrchr(path,0x2f,(long)pcVar12 - (long)path);
      }
      if (pcVar12 != (char *)0x0) {
        pcVar18 = (char *)(*Curl_cmalloc)((size_t)(pcVar12 + (2 - (long)path)));
        pCVar10->path = pcVar18;
        if (pcVar18 == (char *)0x0) {
          bVar26 = true;
        }
        else {
          memcpy(pcVar18,path,(size_t)(pcVar12 + (1 - (long)path)));
          pCVar10->path[(long)(pcVar12 + (1 - (long)path))] = '\0';
          pcVar12 = sanitize_cookie_path(pCVar10->path);
          pCVar10->spath = pcVar12;
          bVar26 = pcVar12 == (char *)0x0;
        }
      }
    }
    if ((bVar26) || (pCVar10->name == (char *)0x0)) goto LAB_00569a5d;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar8 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar8 == 0) {
      lineptr = lineptr + 10;
      pCVar10->httponly = true;
    }
    if (*lineptr == '#') goto LAB_00568d86;
    pcVar12 = strchr(lineptr,0xd);
    if (pcVar12 != (char *)0x0) {
      *pcVar12 = '\0';
    }
    pcVar12 = strchr(lineptr,10);
    if (pcVar12 != (char *)0x0) {
      *pcVar12 = '\0';
    }
    pcVar12 = strtok_r(lineptr,"\t",(char **)name);
    if (pcVar12 == (char *)0x0) {
      bVar26 = false;
      uVar21 = 0;
    }
    else {
      uVar21 = 0;
      bVar26 = false;
      do {
        switch(uVar21) {
        case 0:
          pcVar12 = (*Curl_cstrdup)(pcVar12 + (*pcVar12 == '.'));
          pCVar10->domain = pcVar12;
          if (pcVar12 == (char *)0x0) {
            bVar26 = true;
          }
          uVar21 = 0;
          break;
        case 1:
          iVar8 = Curl_strcasecompare(pcVar12,"TRUE");
          pCVar10->tailmatch = iVar8 != 0;
          uVar21 = 1;
          break;
        case 2:
          iVar8 = strcmp("TRUE",pcVar12);
          if ((iVar8 == 0) || (iVar8 = strcmp("FALSE",pcVar12), iVar8 == 0)) {
            pcVar18 = (*Curl_cstrdup)("/");
            pCVar10->path = pcVar18;
            pcVar17 = (*Curl_cstrdup)("/");
            if (pcVar18 == (char *)0x0) {
              bVar26 = true;
            }
            pCVar10->spath = pcVar17;
            if (pcVar17 == (char *)0x0) {
              bVar26 = true;
            }
            goto switchD_0056937b_caseD_3;
          }
          pcVar12 = (*Curl_cstrdup)(pcVar12);
          pCVar10->path = pcVar12;
          uVar21 = 2;
          uVar5 = 2;
          if (pcVar12 == (char *)0x0) goto LAB_00569570;
          pcVar12 = sanitize_cookie_path(pcVar12);
          pCVar10->spath = pcVar12;
          if (pcVar12 == (char *)0x0) {
            bVar26 = true;
          }
          break;
        case 3:
switchD_0056937b_caseD_3:
          pCVar10->secure = false;
          iVar8 = Curl_strcasecompare(pcVar12,"TRUE");
          uVar21 = 3;
          if (iVar8 != 0) {
            if ((!secure) && (uVar5 = 3, c->running != true)) goto LAB_00569570;
            pCVar10->secure = true;
          }
          break;
        case 4:
          CVar9 = curlx_strtoofft(pcVar12,(char **)0x0,10,&pCVar10->expires);
          if (CVar9 != CURL_OFFT_OK) {
            bVar26 = true;
          }
          uVar21 = 4;
          break;
        case 5:
          pcVar12 = (*Curl_cstrdup)(pcVar12);
          pCVar10->name = pcVar12;
          uVar21 = 5;
          uVar5 = 5;
          if (pcVar12 == (char *)0x0) {
LAB_00569570:
            uVar21 = uVar5;
            bVar26 = true;
          }
          else {
            iVar8 = Curl_strncasecompare("__Secure-",pcVar12,9);
            if (iVar8 == 0) {
              iVar8 = Curl_strncasecompare("__Host-",pCVar10->name,7);
              if (iVar8 != 0) {
                pCVar10->prefix = pCVar10->prefix | 2;
              }
            }
            else {
              pCVar10->prefix = pCVar10->prefix | 1;
            }
          }
          break;
        case 6:
          pcVar12 = (*Curl_cstrdup)(pcVar12);
          pCVar10->value = pcVar12;
          if (pcVar12 == (char *)0x0) {
            bVar26 = true;
          }
          uVar21 = 6;
        }
        pcVar12 = strtok_r((char *)0x0,"\t",(char **)name);
        uVar21 = uVar21 + 1;
      } while ((pcVar12 != (char *)0x0) && (!bVar26));
    }
    if (uVar21 == 6) {
      pcVar12 = (*Curl_cstrdup)("");
      pCVar10->value = pcVar12;
      bVar25 = true;
      if (pcVar12 != (char *)0x0) {
        bVar25 = bVar26;
      }
      bVar26 = bVar25;
      uVar21 = pcVar12 == (char *)0x0 ^ 7;
    }
    if ((bVar26) || (uVar21 != 7)) goto LAB_00569a5d;
  }
  if (((((pCVar10->prefix & 1) == 0) || (pCVar10->secure != false)) &&
      (((pCVar10->prefix & 2) == 0 ||
       ((((pCVar10->secure == true && (pCVar10->path != (char *)0x0)) &&
         (iVar8 = strcmp(pCVar10->path,"/"), iVar8 == 0)) && (pCVar10->tailmatch != true)))))) &&
     (((c->running != false || (c->newsession != true)) || (pCVar10->expires != 0)))) {
    pCVar10->livecookie = c->running;
    iVar8 = c->lastct + 1;
    c->lastct = iVar8;
    pCVar10->creationtime = iVar8;
    if (!noexpire) {
      remove_expired(c);
    }
    sVar16 = cookiehash(pCVar10->domain);
    if (c->cookies[sVar16] == (Cookie *)0x0) {
      bVar26 = false;
      pCVar22 = (Cookie *)0x0;
      local_2070 = pCVar10;
    }
    else {
      bVar26 = false;
      pCVar23 = c->cookies[sVar16];
      do {
        local_2070 = pCVar23;
        iVar8 = Curl_strcasecompare(local_2070->name,pCVar10->name);
        if (iVar8 != 0) {
          pcVar12 = local_2070->domain;
          if (pcVar12 == (char *)0x0) {
LAB_00569867:
            bVar25 = pCVar10->domain == (char *)0x0;
LAB_00569871:
            if (bVar25) {
              bVar26 = true;
            }
          }
          else if (pCVar10->domain == (char *)0x0) {
            if (pcVar12 == (char *)0x0) goto LAB_00569867;
          }
          else {
            iVar8 = Curl_strcasecompare(pcVar12,pCVar10->domain);
            if (iVar8 != 0) {
              bVar25 = local_2070->tailmatch == pCVar10->tailmatch;
              goto LAB_00569871;
            }
          }
          if (bVar26) {
            pcVar12 = local_2070->spath;
            if (pcVar12 == (char *)0x0) {
LAB_005698d3:
              if (pCVar10->spath == (char *)0x0) {
                bVar26 = true;
              }
              else {
LAB_005698df:
                bVar26 = false;
              }
            }
            else {
              pcVar18 = pCVar10->spath;
              if (pcVar18 == (char *)0x0) {
                if (pcVar12 == (char *)0x0) goto LAB_005698d3;
                goto LAB_005698df;
              }
              if ((local_2070->secure != true) || (pCVar10->secure != false || secure)) {
                iVar8 = Curl_strcasecompare(pcVar12,pcVar18);
                bVar26 = iVar8 != 0;
              }
              else {
                pcVar17 = strchr(pcVar12 + 1,0x2f);
                if (pcVar17 == (char *)0x0) {
                  max = strlen(pcVar12);
                }
                else {
                  max = (long)pcVar17 - (long)pcVar12;
                }
                iVar8 = Curl_strncasecompare(pcVar12,pcVar18,max);
                if (iVar8 != 0) goto LAB_00569a5d;
              }
            }
          }
          if (bVar26) {
            if ((pCVar10->livecookie != false) || (local_2070->livecookie != true)) {
              pCVar10->next = local_2070->next;
              pCVar10->creationtime = local_2070->creationtime;
              (*Curl_cfree)(local_2070->name);
              (*Curl_cfree)(local_2070->value);
              (*Curl_cfree)(local_2070->domain);
              (*Curl_cfree)(local_2070->path);
              (*Curl_cfree)(local_2070->spath);
              (*Curl_cfree)(local_2070->expirestr);
              (*Curl_cfree)(local_2070->version);
              (*Curl_cfree)(local_2070->maxage);
              pCVar23 = pCVar10;
              pCVar22 = local_2070;
              for (lVar20 = 0xd; lVar20 != 0; lVar20 = lVar20 + -1) {
                pCVar22->next = pCVar23->next;
                pCVar23 = (Cookie *)((long)pCVar23 + (ulong)bVar27 * -0x10 + 8);
                pCVar22 = (Cookie *)((long)pCVar22 + (ulong)bVar27 * -0x10 + 8);
              }
              (*Curl_cfree)(pCVar10);
              pCVar10 = local_2070;
              do {
                pCVar22 = pCVar10;
                pCVar10 = pCVar22->next;
              } while (pCVar22->next != (Cookie *)0x0);
              break;
            }
            goto LAB_00569a5d;
          }
        }
        ppCVar4 = &local_2070->next;
        pCVar23 = *ppCVar4;
        pCVar22 = local_2070;
        local_2070 = pCVar10;
      } while (*ppCVar4 != (Cookie *)0x0);
    }
    if (c->running == true) {
      pcVar12 = "Added";
      if (bVar26) {
        pcVar12 = "Replaced";
      }
      Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar12,
                 local_2070->name,local_2070->value,local_2070->domain,local_2070->path,
                 local_2070->expires);
    }
    if (!bVar26) {
      pCVar10 = (Cookie *)(c->cookies + sVar16);
      if (pCVar22 != (Cookie *)0x0) {
        pCVar10 = pCVar22;
      }
      pCVar10->next = local_2070;
      c->numcookies = c->numcookies + 1;
      return local_2070;
    }
    return local_2070;
  }
LAB_00569a5d:
  freecookie(pCVar10);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path,   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
                bool secure)  /* TRUE if connection is over secure origin */
{
  struct Cookie *clist;
  struct Cookie *co;
  struct Cookie *lastc = NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */
  size_t myhash;

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    char name[MAX_NAME];
    char what[MAX_NAME];
    const char *ptr;
    const char *semiptr;

    size_t linelength = strlen(lineptr);
    if(linelength > MAX_COOKIE_LINE) {
      /* discard overly long lines at once */
      free(co);
      return NULL;
    }

    semiptr = strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0] = what[0] = 0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_NAME_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len = strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        if(nlen >= (MAX_NAME-1) || len >= (MAX_NAME-1) ||
           ((nlen + len) > MAX_NAME)) {
          /* too long individual name or contents, or too long combination of
             name + contents. Chrome and Firefox support 4095 or 4096 bytes
             combo. */
          freecookie(co);
          infof(data, "oversized cookie dropped, name/val %zu + %zu bytes\n",
                nlen, len);
          return NULL;
        }

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen] = 0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1] = 0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr = what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        /*
         * Check if we have a reserved prefix set before anything else, as we
         * otherwise have to test for the prefix in both the cookie name and
         * "the rest". Prefixes must start with '__' and end with a '-', so
         * only test for names where that can possibly be true.
         */
        if(nlen > 3 && name[0] == '_' && name[1] == '_') {
          if(strncasecompare("__Secure-", name, 9))
            co->prefix |= COOKIE_PREFIX__SECURE;
          else if(strncasecompare("__Host-", name, 7))
            co->prefix |= COOKIE_PREFIX__HOST;
        }

        if(!co->name) {
          /* The very first name/value pair is the actual cookie name */
          if(!sep) {
            /* Bad name/value pair. */
            badcookie = TRUE;
            break;
          }
          co->name = strdup(name);
          co->value = strdup(whatptr);
          done = TRUE;
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          /*
           * secure cookies are only allowed to be set when the connection is
           * using a secure protocol, or when the cookie is being set by
           * reading from file
           */
          if(strcasecompare("secure", name)) {
            if(secure || !c->running) {
              co->secure = TRUE;
            }
            else {
              badcookie = TRUE;
              break;
            }
          }
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          free(co->spath); /* if this is set again */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          if(bad_domain(whatptr))
            domain = ":";
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch = TRUE; /* we always do that if the domain name was
                                       given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie = TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr = semiptr + 1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr = strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr = strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      CURLofft offt;
      offt = curlx_strtoofft((*co->maxage == '\"')?
                             &co->maxage[1]:&co->maxage[0], NULL, 10,
                             &co->expires);
      if(offt == CURL_OFFT_FLOW)
        /* overflow, used max value */
        co->expires = CURL_OFF_T_MAX;
      else if(!offt) {
        if(!co->expires)
          /* already expired */
          co->expires = 1;
        else if(CURL_OFF_T_MAX - now < co->expires)
          /* would overflow */
          co->expires = CURL_OFF_T_MAX;
        else
          co->expires += now;
      }
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain = strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (queryp - path));
      if(endslash) {
        size_t pathlen = (endslash-path + 1); /* include end slash */
        co->path = malloc(pathlen + 1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen] = 0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf = NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr = strchr(lineptr, '\r');
    if(ptr)
      *ptr = 0; /* clear it */
    ptr = strchr(lineptr, '\n');
    if(ptr)
      *ptr = 0; /* clear it */

    firstptr = strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr = firstptr, fields = 0; ptr && !badcookie;
        ptr = strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andrés García:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andrés García made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = FALSE;
        if(strcasecompare(ptr, "TRUE")) {
          if(secure || c->running)
            co->secure = TRUE;
          else
            badcookie = TRUE;
        }
        break;
      case 4:
        if(curlx_strtoofft(ptr, NULL, 10, &co->expires))
          badcookie = TRUE;
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        else {
          /* For Netscape file format cookies we check prefix on the name */
          if(strncasecompare("__Secure-", co->name, 9))
            co->prefix |= COOKIE_PREFIX__SECURE;
          else if(strncasecompare("__Host-", co->name, 7))
            co->prefix |= COOKIE_PREFIX__HOST;
        }
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(co->prefix & COOKIE_PREFIX__SECURE) {
    /* The __Secure- prefix only requires that the cookie be set secure */
    if(!co->secure) {
      freecookie(co);
      return NULL;
    }
  }
  if(co->prefix & COOKIE_PREFIX__HOST) {
    /*
     * The __Host- prefix requires the cookie to be secure, have a "/" path
     * and not have a domain set.
     */
    if(co->secure && co->path && strcmp(co->path, "/") == 0 && !co->tailmatch)
      ;
    else {
      freecookie(co);
      return NULL;
    }
  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;
  co->creationtime = ++c->lastct;

  /* now, we have parsed the incoming line, we must now check if this
     supersedes an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  if(!noexpire)
    remove_expired(c);

#ifdef USE_LIBPSL
  /* Check if the domain is a Public Suffix and if yes, ignore the cookie. */
  if(domain && co->domain && !isip(co->domain)) {
    const psl_ctx_t *psl = Curl_psl_use(data);
    int acceptable;

    if(psl) {
      acceptable = psl_is_cookie_domain_acceptable(psl, domain, co->domain);
      Curl_psl_release(data);
    }
    else
      acceptable = !bad_domain(domain);

    if(!acceptable) {
      infof(data, "cookie '%s' dropped, domain '%s' must not "
                  "set cookies for '%s'\n", co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }
#endif

  myhash = cookiehash(co->domain);
  clist = c->cookies[myhash];
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(clist->secure && !co->secure && !secure) {
            size_t cllen;
            const char *sep;

            /*
             * A non-secure cookie may not overlay an existing secure cookie.
             * For an existing cookie "a" with path "/login", refuse a new
             * cookie "a" with for example path "/login/en", while the path
             * "/loginhelper" is ok.
             */

            sep = strchr(clist->spath + 1, '/');

            if(sep)
              cllen = sep - clist->spath;
            else
              cllen = strlen(clist->spath);

            if(strncasecompare(clist->spath, co->spath, cllen)) {
              freecookie(co);
              return NULL;
            }
          }
          else if(strcasecompare(clist->spath, co->spath))
            replace_old = TRUE;
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* when replacing, creationtime is kept from old */
        co->creationtime = clist->creationtime;

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies[myhash] = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}